

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

void __thiscall
QCalendarWidget::setWeekdayTextFormat
          (QCalendarWidget *this,DayOfWeek dayOfWeek,QTextCharFormat *format)

{
  long lVar1;
  long lVar2;
  QWidget *this_00;
  
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  lVar2 = *(long *)(lVar1 + 600);
  *(undefined1 *)(lVar2 + 0x4f + (long)(int)dayOfWeek) = 1;
  QTextFormat::operator=
            ((QTextFormat *)(lVar2 + ((long)(int)dayOfWeek + -1) * 0x10 + 0x58),
             &format->super_QTextFormat);
  *(undefined8 *)(lVar1 + 0x2d4) = 0xffffffffffffffff;
  this_00 = QAbstractScrollArea::viewport(*(QAbstractScrollArea **)(lVar1 + 0x260));
  QWidget::update(this_00);
  QWidget::updateGeometry(*(QWidget **)(lVar1 + 0x260));
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }